

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

mraa_result_t mraa_gpio_isr_exit(mraa_gpio_context dev)

{
  _func_mraa_result_t_mraa_gpio_context *UNRECOVERED_JUMPTABLE;
  mraa_result_t mVar1;
  int iVar2;
  
  if (dev == (mraa_gpio_context)0x0) {
    return MRAA_ERROR_INVALID_HANDLE;
  }
  if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
     (UNRECOVERED_JUMPTABLE = dev->advance_func->gpio_isr_exit_replace,
     UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_gpio_context *)0x0)) {
    mVar1 = (*UNRECOVERED_JUMPTABLE)(dev);
    return mVar1;
  }
  if (dev->thread_id != 0) {
    dev->isr_thread_terminating = 1;
    if ((plat == (mraa_board_t *)0x0) || (plat->chardev_capable == 0)) {
      mVar1 = mraa_gpio_edge_mode(dev,MRAA_GPIO_EDGE_NONE);
    }
    else {
      _mraa_close_gpio_event_handles(dev);
      mVar1 = MRAA_SUCCESS;
    }
    if ((dev->thread_id != 0) &&
       ((iVar2 = pthread_cancel(dev->thread_id), iVar2 != 0 ||
        (iVar2 = pthread_join(dev->thread_id,(void **)0x0), iVar2 != 0)))) {
      mVar1 = MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->thread_id = 0;
    dev->isr_value_fp = -1;
    dev->isr_thread_terminating = 0;
    if (dev->events != (mraa_gpio_events_t)0x0) {
      free(dev->events);
      dev->events = (mraa_gpio_events_t)0x0;
    }
    return mVar1;
  }
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_gpio_isr_exit(mraa_gpio_context dev)
{
    mraa_result_t ret = MRAA_SUCCESS;

    if (dev == NULL) {
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_isr_exit_replace)) {
        return dev->advance_func->gpio_isr_exit_replace(dev);
    }

    // wasting our time, there is no isr to exit from
    if (dev->thread_id == 0) {
        return ret;
    }
    // mark the beginning of the thread termination process for interested parties
    dev->isr_thread_terminating = 1;

    // stop isr being useful
    if (plat && (plat->chardev_capable))
        _mraa_close_gpio_event_handles(dev);
    else
        ret = mraa_gpio_edge_mode(dev, MRAA_GPIO_EDGE_NONE);

    if ((dev->thread_id != 0)) {
#ifdef HAVE_PTHREAD_CANCEL
        if ((pthread_cancel(dev->thread_id) != 0) || (pthread_join(dev->thread_id, NULL) != 0)) {
            ret = MRAA_ERROR_INVALID_RESOURCE;
        }
#else
        close(dev->isr_control_pipe[1]);
        if (pthread_join(dev->thread_id, NULL) != 0)
            ret = MRAA_ERROR_INVALID_RESOURCE;

        close(dev->isr_control_pipe[0]);
        dev->isr_control_pipe[0] = dev->isr_control_pipe[1] = -1;
#endif
    }

    // assume our thread will exit either way we just lost it's handle
    dev->thread_id = 0;
    dev->isr_value_fp = -1;
    dev->isr_thread_terminating = 0;

    if (dev->events) {
        free(dev->events);
        dev->events = NULL;
    }

    return ret;
}